

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxRestructure2(Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                       int nLutSize,int fVerbose)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Str_Mux_t pTree [10000];
  Str_Mux_t aSStack_9c438 [10000];
  
  iVar4 = -1;
  if (nMuxes < 10000) {
    Str_MuxCreate(aSStack_9c438,pNtk,iMux,nMuxes,vDelay,nLutSize);
    iVar3 = Str_MuxDelayEdge_rec(aSStack_9c438,0);
    bVar2 = true;
    do {
      bVar1 = bVar2;
      iVar4 = Str_MuxRestruct_rec(pNew,pNtk,aSStack_9c438,aSStack_9c438,0,vDelay,fVerbose);
      bVar2 = false;
    } while (iVar4 != 0);
    iVar4 = -1;
    if (!bVar1) {
      iVar4 = Str_MuxDelayEdge_rec(aSStack_9c438,0);
      pNtk->DelayGain = pNtk->DelayGain + (iVar3 - iVar4);
      iVar4 = Str_MuxToGia_rec(pNew,aSStack_9c438,0,vDelay);
    }
  }
  return iVar4;
}

Assistant:

int Str_MuxRestructure2( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose )
{
    int Limit = MAX_TREE;
    Str_Mux_t pTree[MAX_TREE];
    int Delay, Delay2, fChanges = 0;
    if ( nMuxes >= Limit )
        return -1;
    assert( nMuxes < Limit );
    Str_MuxCreate( pTree, pNtk, iMux, nMuxes, vDelay, nLutSize );
    Delay = Str_MuxDelayEdge_rec( pTree, 0 );
    while ( 1 )
    {     
        if ( !Str_MuxRestruct_rec(pNew, pNtk, pTree, pTree, 0, vDelay, fVerbose) )
            break;
        fChanges = 1;
    }
    if ( !fChanges )
        return -1;
    Delay2 = Str_MuxDelayEdge_rec( pTree, 0 );
//    printf( "Improved delay for tree %d with %d MUXes (%d -> %d).\n", iMux, nMuxes, Delay, Delay2 );
    pNtk->DelayGain += Delay - Delay2;
    return Str_MuxToGia_rec( pNew, pTree, 0, vDelay );
}